

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O2

RK_S32 __thiscall
VpuApiLegacy::encoder_sendframe
          (VpuApiLegacy *this,VpuCodecContext *ctx,EncInputStream_t *aEncInStrm)

{
  uint uVar1;
  RK_S64 RVar2;
  size_t __n;
  ulong __n_00;
  MPP_RET MVar3;
  uint uVar4;
  int iVar5;
  MppMeta meta;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  MppFrameFormat MVar9;
  VpuApiLegacy *pVVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  MppFrame frame;
  ulong local_b8;
  size_t local_b0;
  RK_U8 *local_a8;
  ulong local_a0;
  EncInputStream_t *local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  VpuApiLegacy *local_78;
  int local_6c;
  ulong local_68;
  undefined8 local_60;
  MppBufferInfo inputCommit;
  
  local_78 = this;
  if (((byte)vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","enter\n","encoder_sendframe");
  }
  uVar4 = ctx->width;
  uVar7 = ctx->height;
  RVar2 = aEncInStrm->timeUs;
  local_68 = (ulong)(uint)aEncInStrm->size;
  uVar1 = aEncInStrm->bufPhyAddr;
  frame = (MppFrame)0x0;
  MVar3 = mpp_frame_init();
  if (MVar3 != MPP_OK) {
    _mpp_log_l(2,"vpu_api_legacy","mpp_frame_init failed\n","encoder_sendframe");
    goto LAB_00108371;
  }
  local_90 = CONCAT44(local_90._4_4_,uVar4 + 0xf);
  local_b8 = (ulong)(uVar4 + 0xf & 0xfffffff0);
  uVar14 = uVar7 + 7 & 0xfffffff8;
  local_a0 = (ulong)uVar4;
  local_80 = (ulong)uVar1;
  mpp_frame_set_width(frame,uVar4);
  local_88 = (ulong)uVar7;
  mpp_frame_set_height(frame,uVar7);
  mpp_frame_set_ver_stride(frame,uVar14);
  mpp_frame_set_pts(frame,RVar2);
  uVar13 = local_68;
  pVVar10 = local_78;
  MVar9 = local_78->format & 0xfffff;
  uVar4 = MVar9 - MPP_FMT_RGB565;
  if (uVar4 < 0xe) {
    iVar5 = (int)local_b8;
    if ((0xfU >> (uVar4 & 0x1f) & 1) == 0) {
      if ((0x3c00U >> (uVar4 & 0x1f) & 1) == 0) {
        if ((0xc0U >> (uVar4 & 0x1f) & 1) == 0) goto LAB_0010848d;
        uVar8 = (ulong)(uint)(iVar5 * 3);
      }
      else {
        uVar8 = (ulong)(uint)(iVar5 * 4);
      }
    }
    else {
      uVar8 = (ulong)(uint)(iVar5 * 2);
    }
LAB_001084ae:
    mpp_frame_set_hor_stride(frame,uVar8);
  }
  else {
LAB_0010848d:
    if ((MVar9 < MPP_FMT_YUV422P) &&
       (uVar8 = local_b8,
       (0x31U >> (local_78->format & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) != 0))
    goto LAB_001084ae;
    _mpp_log_l(2,"vpu_api_legacy","unsupport format 0x%x\n",0);
  }
  mpp_frame_set_fmt(frame,pVVar10->format & 0xfffff);
  if (aEncInStrm->nFlags != 0) {
    _mpp_log_l(4,"vpu_api_legacy","found eos true\n","encoder_sendframe");
    mpp_frame_set_eos(frame,1);
  }
  if (uVar13 == 0) {
    mpp_frame_set_buffer(frame,0);
    if (aEncInStrm->nFlags == 0) {
      _mpp_log_l(2,"vpu_api_legacy","found empty frame without eos flag set!\n","encoder_sendframe")
      ;
    }
  }
  else {
    iVar5 = pVVar10->fd_input;
    if (iVar5 < 0) {
      iVar5 = is_valid_dma_fd((int)local_80);
      pVVar10->fd_input = iVar5;
    }
    if (iVar5 == 0) {
      if (aEncInStrm->buf == (RK_U8 *)0x0) {
        MVar3 = MPP_ERR_NULL_PTR;
        goto LAB_00108371;
      }
      MVar9 = pVVar10->format;
      if (MVar9 < MPP_FMT_YUV_BUTT) {
        uVar4 = (uVar14 + 0xf & 0xfffffff0) * (int)local_b8 * 3 >> 1;
      }
      else if (MVar9 - MPP_FMT_RGB565 < 7) {
        uVar4 = (uVar14 + 0xf & 0xfffffff0) * (int)local_b8 * 3;
      }
      else {
        if ((MVar9 & ~MPP_FMT_YUV422SP_VU) != MPP_FMT_RGB101010) {
          _mpp_log_l(2,"vpu_api_legacy","unsupport input format:%d\n","encoder_sendframe");
          MVar3 = MPP_NOK;
          goto LAB_00108371;
        }
        uVar4 = (uVar14 + 0xf & 0x3ffffff0) * (int)local_b8 * 4;
      }
      if (uVar4 != 0) {
        inputCommit.type = MPP_BUFFER_TYPE_NORMAL;
        inputCommit._4_4_ = 0;
        local_98 = aEncInStrm;
        MVar3 = mpp_buffer_get_with_tag
                          (pVVar10->memGroup,&inputCommit,uVar4,"vpu_api_legacy","encoder_sendframe"
                          );
        if (MVar3 != MPP_OK) {
          pcVar6 = "allocate input picture buffer failed\n";
          goto LAB_00108580;
        }
        local_b0 = mpp_buffer_get_ptr_with_caller(inputCommit._0_8_,"encoder_sendframe");
        uVar8 = local_88;
        aEncInStrm = local_98;
        uVar13 = local_a0;
        local_a8 = local_98->buf;
        MVar9 = pVVar10->format;
        iVar5 = (int)local_a0;
        if (MVar9 - MPP_FMT_ARGB8888 < 4) {
          local_b8 = (ulong)(uint)((int)local_b8 << 2);
          uVar8 = 0;
          uVar4 = 0;
          uVar13 = local_88;
          while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
            memcpy((void *)(uVar8 + local_b0),local_a8 + uVar4,(ulong)(uint)(iVar5 * 4));
            uVar4 = uVar4 + iVar5 * 4;
            uVar8 = (ulong)(uint)((int)uVar8 + (int)local_b8);
          }
        }
        else if (MVar9 - MPP_FMT_RGB888 < 2) {
          uVar4 = (uint)local_90 >> 4;
          uVar8 = 0;
          uVar7 = 0;
          uVar13 = local_88;
          while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
            memcpy((void *)(uVar8 + local_b0),local_a8 + uVar7,(ulong)(uint)(iVar5 * 3));
            uVar7 = uVar7 + iVar5 * 3;
            uVar8 = (ulong)((int)uVar8 + uVar4 * 0x30);
          }
        }
        else {
          local_90 = local_b0 + uVar14 * (int)local_b8;
          if ((MVar9 == MPP_FMT_YUV420SP) || (MVar9 == MPP_FMT_YUV420SP_VU)) {
            uVar12 = 0;
            uVar16 = 0;
            uVar11 = local_88;
            while (aEncInStrm = local_98, __n_00 = local_a0, bVar17 = uVar11 != 0,
                  uVar11 = uVar11 - 1, bVar17) {
              memcpy((void *)(uVar12 + local_b0),local_a8 + uVar16,uVar13);
              uVar16 = (ulong)(uint)((int)uVar16 + iVar5);
              uVar12 = (ulong)(uint)((int)uVar12 + (int)local_b8);
            }
            uVar13 = uVar8 >> 1 & 0x7fffffff;
            uVar8 = 0;
            while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
              memcpy((void *)(uVar8 + local_90),local_a8 + uVar16,__n_00);
              uVar16 = (ulong)(uint)((int)uVar16 + (int)__n_00);
              uVar8 = (ulong)(uint)((int)uVar8 + (int)local_b8);
            }
          }
          else if (MVar9 == MPP_FMT_YUV420P) {
            lVar15 = (ulong)(uVar14 * (int)local_b8 >> 2) + local_90;
            uVar4 = 0;
            uVar12 = 0;
            uVar11 = local_88;
            while (aEncInStrm = local_98, bVar17 = uVar11 != 0, uVar11 = uVar11 - 1, bVar17) {
              memcpy((void *)(uVar4 + local_b0),local_a8 + uVar12,uVar13);
              uVar12 = (ulong)(uint)((int)uVar12 + iVar5);
              uVar4 = uVar4 + (int)local_b8;
            }
            uVar8 = uVar8 >> 1 & 0x7fffffff;
            uVar13 = local_a0 >> 1 & 0x7fffffff;
            uVar4 = 0;
            local_6c = (int)uVar8;
            local_b0 = uVar13;
            while (__n = local_b0, iVar5 = (int)uVar8, uVar8 = (ulong)(iVar5 - 1), iVar5 != 0) {
              memcpy((void *)((ulong)(uVar4 >> 1) + local_90),local_a8 + uVar12,uVar13);
              uVar12 = (ulong)(uint)((int)uVar12 + (int)uVar13);
              uVar4 = uVar4 + (int)local_b8;
            }
            uVar4 = 0;
            iVar5 = local_6c;
            while (bVar17 = iVar5 != 0, iVar5 = iVar5 + -1, bVar17) {
              memcpy((void *)((ulong)(uVar4 >> 1) + lVar15),local_a8 + uVar12,__n);
              uVar12 = (ulong)(uint)((int)uVar12 + (int)__n);
              uVar4 = uVar4 + (int)local_b8;
            }
          }
          else {
            _mpp_log_l(2,"vpu_api_legacy","unsupport align fmt:%d now\n",0);
            aEncInStrm = local_98;
          }
        }
        mpp_frame_set_buffer(frame,inputCommit._0_8_);
        mpp_buffer_put_with_caller(inputCommit._0_8_,"encoder_sendframe");
        uVar13 = local_68;
        pVVar10 = local_78;
      }
    }
    else {
      inputCommit.ptr = (void *)0x0;
      inputCommit.hnd = (void *)0x0;
      inputCommit.type = MPP_BUFFER_TYPE_ION;
      inputCommit._4_4_ = 0;
      inputCommit.size = uVar13;
      inputCommit._32_8_ = local_80 & 0xffffffff;
      local_60 = 0;
      MVar3 = mpp_buffer_import_with_tag
                        (0,&inputCommit,&local_60,"vpu_api_legacy","encoder_sendframe");
      if (MVar3 != MPP_OK) {
        pcVar6 = "import input picture buffer failed\n";
LAB_00108580:
        _mpp_log_l(2,"vpu_api_legacy",pcVar6,"encoder_sendframe");
        goto LAB_00108371;
      }
      mpp_frame_set_buffer(frame,local_60);
      mpp_buffer_put_with_caller(local_60,"encoder_sendframe");
      pVVar10 = local_78;
    }
  }
  if (((byte)vpu_api_debug & 0x10) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","w %d h %d input fd %d size %d pts %lld, flag %d \n",
               "encoder_sendframe",local_a0,local_88,local_80,uVar13,aEncInStrm->timeUs,
               aEncInStrm->nFlags);
  }
  if (pVVar10->mlvec != (VpuApiMlvec)0x0) {
    meta = (MppMeta)mpp_frame_get_meta(frame);
    vpu_api_mlvec_set_dy_cfg(pVVar10->mlvec,&pVVar10->mlvec_dy_cfg,meta);
  }
  MVar3 = (*pVVar10->mpi->encode_put_frame)(pVVar10->mpp_ctx,frame);
  if (MVar3 == MPP_OK) {
    aEncInStrm->size = 0;
    MVar3 = MPP_OK;
  }
  else {
    _mpp_log_l(2,"vpu_api_legacy","encode_put_frame ret %d\n","encoder_sendframe",MVar3);
  }
LAB_00108371:
  if (frame != (MppFrame)0x0) {
    mpp_frame_deinit(&frame);
  }
  if (((byte)vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","leave ret %d\n","encoder_sendframe",MVar3);
  }
  return MVar3;
}

Assistant:

RK_S32 VpuApiLegacy::encoder_sendframe(VpuCodecContext *ctx, EncInputStream_t *aEncInStrm)
{
    RK_S32 ret = 0;
    vpu_api_dbg_func("enter\n");

    RK_U32 width        = ctx->width;
    RK_U32 height       = ctx->height;
    RK_U32 hor_stride   = MPP_ALIGN(width,  16);
    RK_U32 ver_stride   = MPP_ALIGN(height, 8);
    RK_S64 pts          = aEncInStrm->timeUs;
    RK_S32 fd           = aEncInStrm->bufPhyAddr;
    RK_U32 size         = aEncInStrm->size;

    /* try import input buffer and output buffer */
    MppFrame frame = NULL;

    ret = mpp_frame_init(&frame);
    if (MPP_OK != ret) {
        mpp_err_f("mpp_frame_init failed\n");
        goto FUNC_RET;
    }

    mpp_frame_set_width(frame, width);
    mpp_frame_set_height(frame, height);
    mpp_frame_set_ver_stride(frame, ver_stride);
    mpp_frame_set_pts(frame, pts);
    switch (format & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420P :
    case MPP_FMT_YUV420SP :
    case MPP_FMT_YUV420SP_VU : {
        mpp_frame_set_hor_stride(frame, hor_stride);
    } break;
    case MPP_FMT_RGB565:
    case MPP_FMT_BGR565:
    case MPP_FMT_RGB555:
    case MPP_FMT_BGR555: {
        mpp_frame_set_hor_stride(frame, hor_stride * 2);
    } break;
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 : {
        mpp_frame_set_hor_stride(frame, hor_stride * 3);
    } break;
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        mpp_frame_set_hor_stride(frame, hor_stride * 4);
    } break;
    default: {
        mpp_err("unsupport format 0x%x\n", format & MPP_FRAME_FMT_MASK);
    } break;
    }
    mpp_frame_set_fmt(frame, (MppFrameFormat)(format & MPP_FRAME_FMT_MASK));
    if (aEncInStrm->nFlags) {
        mpp_log_f("found eos true\n");
        mpp_frame_set_eos(frame, 1);
    }

    if (size <= 0) {
        mpp_frame_set_buffer(frame, NULL);
        if (!aEncInStrm->nFlags)
            mpp_err_f("found empty frame without eos flag set!\n");
        goto PUT_FRAME;
    }

    if (fd_input < 0) {
        fd_input = is_valid_dma_fd(fd);
    }
    if (fd_input) {
        MppBufferInfo   inputCommit;

        memset(&inputCommit, 0, sizeof(inputCommit));
        inputCommit.type = MPP_BUFFER_TYPE_ION;
        inputCommit.size = size;
        inputCommit.fd = fd;
        if (size > 0) {
            MppBuffer buffer = NULL;
            ret = mpp_buffer_import(&buffer, &inputCommit);
            if (ret) {
                mpp_err_f("import input picture buffer failed\n");
                goto FUNC_RET;
            }
            mpp_frame_set_buffer(frame, buffer);
            mpp_buffer_put(buffer);
            buffer = NULL;
        }
    } else {
        RK_U32 align_size   = 0;

        if (NULL == aEncInStrm->buf) {
            ret = MPP_ERR_NULL_PTR;
            goto FUNC_RET;
        }
        if (format >= MPP_FMT_YUV420SP && format < MPP_FMT_YUV_BUTT) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 3 / 2;
        } else  if (format >= MPP_FMT_YUV420SP_VU && format < MPP_FMT_YUV_BUTT) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 3 / 2;
        } else if (format >= MPP_FMT_RGB565 && format < MPP_FMT_BGR888) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 3;
        } else if (format >= MPP_FMT_RGB101010 && format < MPP_FMT_RGB_BUTT) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 4;
        } else {
            mpp_err_f("unsupport input format:%d\n", format);
            ret = MPP_NOK;
            goto FUNC_RET;
        }
        if (align_size > 0) {
            MppBuffer buffer = NULL;
            ret = mpp_buffer_get(memGroup, &buffer, align_size);
            if (ret) {
                mpp_err_f("allocate input picture buffer failed\n");
                goto FUNC_RET;
            }
            copy_align_raw_buffer_to_dest((RK_U8 *)mpp_buffer_get_ptr(buffer),
                                          aEncInStrm->buf, width, height, format);
            mpp_frame_set_buffer(frame, buffer);
            mpp_buffer_put(buffer);
            buffer = NULL;
        }
    }

PUT_FRAME:

    vpu_api_dbg_input("w %d h %d input fd %d size %d pts %lld, flag %d \n",
                      width, height, fd, size, aEncInStrm->timeUs, aEncInStrm->nFlags);
    if (mlvec) {
        MppMeta meta = mpp_frame_get_meta(frame);

        vpu_api_mlvec_set_dy_cfg(mlvec, &mlvec_dy_cfg, meta);
    }

    ret = mpi->encode_put_frame(mpp_ctx, frame);
    if (ret)
        mpp_err_f("encode_put_frame ret %d\n", ret);
    else
        aEncInStrm->size = 0;

FUNC_RET:
    if (frame)
        mpp_frame_deinit(&frame);

    vpu_api_dbg_func("leave ret %d\n", ret);
    return ret;
}